

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  BYTE *iEnd;
  BYTE *iStart;
  int *piVar1;
  uint uVar2;
  uint uVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  U32 *pUVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  U32 UVar11;
  BYTE *pBVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  BYTE *pBVar17;
  uint uVar18;
  BYTE *pBVar19;
  BYTE *pBVar20;
  uint uVar21;
  int *ip;
  int iVar22;
  ulong uVar23;
  int *piVar24;
  bool bVar25;
  uint local_124;
  uint local_cc;
  int *local_c8;
  int local_9c;
  
  iEnd = (BYTE *)((long)src + srcSize);
  piVar1 = (int *)((long)src + (srcSize - 8));
  pBVar4 = (ms->window).base;
  pBVar5 = (ms->window).dictBase;
  uVar2 = (ms->window).dictLimit;
  uVar3 = (ms->window).lowLimit;
  pBVar12 = pBVar5 + uVar2;
  local_124 = *rep;
  local_cc = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  iStart = pBVar4 + uVar2;
  ip = (int *)((ulong)(iStart == (BYTE *)src) + (long)src);
  iVar8 = uVar2 - 1;
LAB_0018db90:
  do {
    if (piVar1 <= ip) {
      *rep = local_124;
      rep[1] = local_cc;
      return (long)iEnd - (long)src;
    }
    iVar22 = (int)ip;
    local_9c = iVar22 - (int)pBVar4;
    uVar9 = (local_9c - local_124) + 1;
    pBVar17 = pBVar4;
    if (uVar9 < uVar2) {
      pBVar17 = pBVar5;
    }
    if ((uVar3 < uVar9 && 2 < iVar8 - uVar9) &&
       (*(int *)((long)ip + 1) == *(int *)(pBVar17 + uVar9))) {
      pBVar19 = iEnd;
      if (uVar9 < uVar2) {
        pBVar19 = pBVar12;
      }
      sVar13 = ZSTD_count_2segments
                         ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar17 + uVar9) + 4),iEnd,pBVar19,
                          iStart);
      uVar14 = sVar13 + 4;
    }
    else {
      uVar14 = 0;
    }
    if (cParams->searchLength - 6 < 2) {
      pUVar6 = ms->chainTable;
      uVar10 = 1 << ((byte)cParams->chainLog & 0x1f);
      pBVar17 = (ms->window).base;
      pBVar19 = (ms->window).dictBase;
      uVar9 = (ms->window).dictLimit;
      uVar18 = (ms->window).lowLimit;
      uVar21 = iVar22 - (int)pBVar17;
      uVar7 = uVar21 - uVar10;
      if (uVar21 < uVar10) {
        uVar7 = 0;
      }
      iVar22 = 1 << ((byte)cParams->searchLog & 0x1f);
      UVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,6);
      uVar23 = 99999999;
      uVar16 = 3;
      while( true ) {
        bVar25 = iVar22 == 0;
        iVar22 = iVar22 + -1;
        if ((UVar11 <= uVar18) || (bVar25)) break;
        if (UVar11 < uVar9) {
          if (*(int *)(pBVar19 + UVar11) == *ip) {
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)(ip + 1),pBVar19 + (ulong)UVar11 + 4,iEnd,pBVar19 + uVar9,
                                pBVar17 + uVar9);
            uVar15 = sVar13 + 4;
LAB_0018dd5c:
            if ((uVar16 < uVar15) &&
               (uVar23 = (ulong)((uVar21 + 2) - UVar11), uVar16 = uVar15,
               (BYTE *)((long)ip + uVar15) == iEnd)) break;
          }
        }
        else if ((pBVar17 + UVar11)[uVar16] == *(BYTE *)((long)ip + uVar16)) {
          uVar15 = ZSTD_count((BYTE *)ip,pBVar17 + UVar11,iEnd);
          goto LAB_0018dd5c;
        }
        if (UVar11 <= uVar7) break;
        UVar11 = pUVar6[UVar11 & uVar10 - 1];
      }
    }
    else if (cParams->searchLength == 5) {
      pUVar6 = ms->chainTable;
      uVar10 = 1 << ((byte)cParams->chainLog & 0x1f);
      pBVar17 = (ms->window).base;
      pBVar19 = (ms->window).dictBase;
      uVar9 = (ms->window).dictLimit;
      uVar18 = (ms->window).lowLimit;
      uVar21 = iVar22 - (int)pBVar17;
      uVar7 = uVar21 - uVar10;
      if (uVar21 < uVar10) {
        uVar7 = 0;
      }
      iVar22 = 1 << ((byte)cParams->searchLog & 0x1f);
      UVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,5);
      uVar23 = 99999999;
      uVar16 = 3;
      while( true ) {
        bVar25 = iVar22 == 0;
        iVar22 = iVar22 + -1;
        if ((UVar11 <= uVar18) || (bVar25)) break;
        if (UVar11 < uVar9) {
          if (*(int *)(pBVar19 + UVar11) == *ip) {
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)(ip + 1),pBVar19 + (ulong)UVar11 + 4,iEnd,pBVar19 + uVar9,
                                pBVar17 + uVar9);
            uVar15 = sVar13 + 4;
LAB_0018deb9:
            if ((uVar16 < uVar15) &&
               (uVar23 = (ulong)((uVar21 + 2) - UVar11), uVar16 = uVar15,
               (BYTE *)((long)ip + uVar15) == iEnd)) break;
          }
        }
        else if ((pBVar17 + UVar11)[uVar16] == *(BYTE *)((long)ip + uVar16)) {
          uVar15 = ZSTD_count((BYTE *)ip,pBVar17 + UVar11,iEnd);
          goto LAB_0018deb9;
        }
        if (UVar11 <= uVar7) break;
        UVar11 = pUVar6[UVar11 & uVar10 - 1];
      }
    }
    else {
      pUVar6 = ms->chainTable;
      uVar10 = 1 << ((byte)cParams->chainLog & 0x1f);
      pBVar17 = (ms->window).base;
      pBVar19 = (ms->window).dictBase;
      uVar9 = (ms->window).dictLimit;
      uVar18 = (ms->window).lowLimit;
      uVar21 = iVar22 - (int)pBVar17;
      uVar7 = uVar21 - uVar10;
      if (uVar21 < uVar10) {
        uVar7 = 0;
      }
      iVar22 = 1 << ((byte)cParams->searchLog & 0x1f);
      UVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,4);
      uVar23 = 99999999;
      uVar16 = 3;
      while( true ) {
        bVar25 = iVar22 == 0;
        iVar22 = iVar22 + -1;
        if ((UVar11 <= uVar18) || (bVar25)) break;
        if (UVar11 < uVar9) {
          if (*(int *)(pBVar19 + UVar11) == *ip) {
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)(ip + 1),pBVar19 + (ulong)UVar11 + 4,iEnd,pBVar19 + uVar9,
                                pBVar17 + uVar9);
            uVar15 = sVar13 + 4;
LAB_0018e015:
            if ((uVar16 < uVar15) &&
               (uVar23 = (ulong)((uVar21 + 2) - UVar11), uVar16 = uVar15,
               (BYTE *)((long)ip + uVar15) == iEnd)) break;
          }
        }
        else if ((pBVar17 + UVar11)[uVar16] == *(BYTE *)((long)ip + uVar16)) {
          uVar15 = ZSTD_count((BYTE *)ip,pBVar17 + UVar11,iEnd);
          goto LAB_0018e015;
        }
        if (UVar11 <= uVar7) break;
        UVar11 = pUVar6[UVar11 & uVar10 - 1];
      }
    }
    uVar15 = uVar14;
    if (uVar14 < uVar16) {
      uVar15 = uVar16;
    }
    if (uVar15 < 4) {
      ip = (int *)((long)ip + ((long)ip - (long)src >> 8) + 1);
      goto LAB_0018db90;
    }
    piVar24 = ip;
    if (uVar16 <= uVar14) {
      uVar23 = 0;
      piVar24 = (int *)((long)ip + 1);
    }
    do {
      uVar16 = uVar23;
      uVar14 = uVar15;
      local_c8 = piVar24;
      if (piVar1 <= ip) break;
      piVar24 = (int *)((long)ip + 1);
      local_9c = local_9c + 1;
      if (uVar16 == 0) {
        uVar16 = 0;
      }
      else {
        uVar9 = local_9c - local_124;
        pBVar17 = pBVar4;
        if (uVar9 < uVar2) {
          pBVar17 = pBVar5;
        }
        if ((uVar3 < uVar9 && 2 < iVar8 - uVar9) && (*piVar24 == *(int *)(pBVar17 + uVar9))) {
          pBVar19 = iEnd;
          if (uVar9 < uVar2) {
            pBVar19 = pBVar12;
          }
          sVar13 = ZSTD_count_2segments
                             ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar17 + uVar9) + 4),iEnd,
                              pBVar19,iStart);
          if (sVar13 < 0xfffffffffffffffc) {
            uVar18 = (int)uVar16 + 1;
            uVar9 = 0x1f;
            if (uVar18 != 0) {
              for (; uVar18 >> uVar9 == 0; uVar9 = uVar9 - 1) {
              }
            }
            if ((int)((uVar9 ^ 0x1f) + (int)uVar14 * 3 + -0x1e) < (int)(sVar13 + 4) * 3) {
              uVar16 = 0;
              uVar14 = sVar13 + 4;
              local_c8 = piVar24;
            }
          }
        }
      }
      iVar22 = (int)piVar24;
      if (cParams->searchLength - 6 < 2) {
        pUVar6 = ms->chainTable;
        uVar10 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar17 = (ms->window).base;
        pBVar19 = (ms->window).dictBase;
        uVar9 = (ms->window).dictLimit;
        uVar18 = (ms->window).lowLimit;
        uVar21 = iVar22 - (int)pBVar17;
        uVar7 = uVar21 - uVar10;
        if (uVar21 < uVar10) {
          uVar7 = 0;
        }
        iVar22 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)piVar24,6);
        uVar23 = 99999999;
        uVar15 = 3;
        while( true ) {
          bVar25 = iVar22 == 0;
          iVar22 = iVar22 + -1;
          if ((UVar11 <= uVar18) || (bVar25)) break;
          if (UVar11 < uVar9) {
            if (*(int *)(pBVar19 + UVar11) == *piVar24) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)((long)ip + 5),pBVar19 + (ulong)UVar11 + 4,iEnd,
                                  pBVar19 + uVar9,pBVar17 + uVar9);
              sVar13 = sVar13 + 4;
LAB_0018e2cb:
              if ((uVar15 < sVar13) &&
                 (uVar23 = (ulong)((uVar21 + 2) - UVar11), uVar15 = sVar13,
                 (BYTE *)((long)piVar24 + sVar13) == iEnd)) break;
            }
          }
          else if ((pBVar17 + UVar11)[uVar15] == *(BYTE *)((long)piVar24 + uVar15)) {
            sVar13 = ZSTD_count((BYTE *)piVar24,pBVar17 + UVar11,iEnd);
            goto LAB_0018e2cb;
          }
          if (UVar11 <= uVar7) break;
          UVar11 = pUVar6[UVar11 & uVar10 - 1];
        }
      }
      else if (cParams->searchLength == 5) {
        pUVar6 = ms->chainTable;
        uVar10 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar17 = (ms->window).base;
        pBVar19 = (ms->window).dictBase;
        uVar9 = (ms->window).dictLimit;
        uVar18 = (ms->window).lowLimit;
        uVar21 = iVar22 - (int)pBVar17;
        uVar7 = uVar21 - uVar10;
        if (uVar21 < uVar10) {
          uVar7 = 0;
        }
        iVar22 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)piVar24,5);
        uVar23 = 99999999;
        uVar15 = 3;
        while( true ) {
          bVar25 = iVar22 == 0;
          iVar22 = iVar22 + -1;
          if ((UVar11 <= uVar18) || (bVar25)) break;
          if (UVar11 < uVar9) {
            if (*(int *)(pBVar19 + UVar11) == *piVar24) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)((long)ip + 5),pBVar19 + (ulong)UVar11 + 4,iEnd,
                                  pBVar19 + uVar9,pBVar17 + uVar9);
              sVar13 = sVar13 + 4;
LAB_0018e433:
              if ((uVar15 < sVar13) &&
                 (uVar23 = (ulong)((uVar21 + 2) - UVar11), uVar15 = sVar13,
                 (BYTE *)((long)piVar24 + sVar13) == iEnd)) break;
            }
          }
          else if ((pBVar17 + UVar11)[uVar15] == *(BYTE *)((long)piVar24 + uVar15)) {
            sVar13 = ZSTD_count((BYTE *)piVar24,pBVar17 + UVar11,iEnd);
            goto LAB_0018e433;
          }
          if (UVar11 <= uVar7) break;
          UVar11 = pUVar6[UVar11 & uVar10 - 1];
        }
      }
      else {
        pUVar6 = ms->chainTable;
        uVar10 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar17 = (ms->window).base;
        pBVar19 = (ms->window).dictBase;
        uVar9 = (ms->window).dictLimit;
        uVar18 = (ms->window).lowLimit;
        uVar21 = iVar22 - (int)pBVar17;
        uVar7 = uVar21 - uVar10;
        if (uVar21 < uVar10) {
          uVar7 = 0;
        }
        iVar22 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)piVar24,4);
        uVar23 = 99999999;
        uVar15 = 3;
        while( true ) {
          bVar25 = iVar22 == 0;
          iVar22 = iVar22 + -1;
          if ((UVar11 <= uVar18) || (bVar25)) break;
          if (UVar11 < uVar9) {
            if (*(int *)(pBVar19 + UVar11) == *piVar24) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)((long)ip + 5),pBVar19 + (ulong)UVar11 + 4,iEnd,
                                  pBVar19 + uVar9,pBVar17 + uVar9);
              sVar13 = sVar13 + 4;
LAB_0018e592:
              if ((uVar15 < sVar13) &&
                 (uVar23 = (ulong)((uVar21 + 2) - UVar11), uVar15 = sVar13,
                 (BYTE *)((long)piVar24 + sVar13) == iEnd)) break;
            }
          }
          else if ((pBVar17 + UVar11)[uVar15] == *(BYTE *)((long)piVar24 + uVar15)) {
            sVar13 = ZSTD_count((BYTE *)piVar24,pBVar17 + UVar11,iEnd);
            goto LAB_0018e592;
          }
          if (UVar11 <= uVar7) break;
          UVar11 = pUVar6[UVar11 & uVar10 - 1];
        }
      }
      if (uVar15 < 4) break;
      uVar18 = (int)uVar16 + 1;
      uVar9 = 0x1f;
      if (uVar18 != 0) {
        for (; uVar18 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar18 = (int)uVar23 + 1;
      iVar22 = 0x1f;
      if (uVar18 != 0) {
        for (; uVar18 >> iVar22 == 0; iVar22 = iVar22 + -1) {
        }
      }
      ip = piVar24;
    } while ((int)((uVar9 ^ 0x1f) + (int)uVar14 * 4 + -0x1b) < (int)uVar15 * 4 - iVar22);
    UVar11 = (U32)uVar16;
    if (uVar16 == 0) {
      UVar11 = 0;
    }
    else {
      pBVar20 = (BYTE *)((long)local_c8 + (-(long)pBVar4 - uVar16) + 2);
      pBVar19 = iStart;
      pBVar17 = pBVar4;
      if ((uint)pBVar20 < uVar2) {
        pBVar19 = pBVar5 + uVar3;
        pBVar17 = pBVar5;
      }
      pBVar17 = pBVar17 + ((ulong)pBVar20 & 0xffffffff);
      for (; ((src < local_c8 && (pBVar19 < pBVar17)) &&
             (*(BYTE *)((long)local_c8 + -1) == pBVar17[-1]));
          local_c8 = (int *)((long)local_c8 + -1)) {
        pBVar17 = pBVar17 + -1;
        uVar14 = uVar14 + 1;
      }
      local_cc = local_124;
      local_124 = UVar11 - 2;
    }
    ZSTD_storeSeq(seqStore,(long)local_c8 - (long)src,src,UVar11,uVar14 - 3);
    uVar9 = local_cc;
    for (ip = (int *)((long)local_c8 + uVar14); local_cc = uVar9, src = ip, ip <= piVar1;
        ip = (int *)((long)ip + sVar13 + 4)) {
      uVar9 = (uint)((long)ip - (long)(pBVar4 + local_cc));
      pBVar17 = pBVar4;
      if (uVar9 < uVar2) {
        pBVar17 = pBVar5;
      }
      if (((uVar9 <= uVar3) || (iVar8 - uVar9 < 3)) ||
         (*ip != *(int *)(pBVar17 + ((long)ip - (long)(pBVar4 + local_cc) & 0xffffffff)))) break;
      pBVar19 = iEnd;
      if (uVar9 < uVar2) {
        pBVar19 = pBVar12;
      }
      sVar13 = ZSTD_count_2segments
                         ((BYTE *)(ip + 1),
                          (BYTE *)((long)(pBVar17 +
                                         ((long)ip - (long)(pBVar4 + local_cc) & 0xffffffff)) + 4),
                          iEnd,pBVar19,iStart);
      ZSTD_storeSeq(seqStore,0,ip,0,sVar13 + 1);
      uVar9 = local_124;
      local_124 = local_cc;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, cParams, src, srcSize, 0, 1);
}